

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::InsertOneLoopProbe(Lowerer *this,Instr *insertInstr,LabelInstr *loopLabel)

{
  RegNum reg;
  IRKind IVar1;
  int iVar2;
  ThreadContextInfo *pTVar3;
  undefined4 extraout_var;
  MemRefOpnd *compareSrc2;
  RegOpnd *compareSrc1;
  LabelInstr *instr_00;
  HelperCallOpnd *newSrc;
  Instr *pIVar4;
  BranchInstr *instr_01;
  bool local_51;
  Instr *instr;
  HelperCallOpnd *helperOpnd;
  LabelInstr *helperLabel;
  RegOpnd *regStackPointer;
  Opnd *memRefOpnd;
  LabelInstr *loopLabel_local;
  Instr *insertInstr_local;
  Lowerer *this_local;
  
  pTVar3 = Func::GetThreadContextInfo(this->m_func);
  iVar2 = (*pTVar3->_vptr_ThreadContextInfo[3])();
  compareSrc2 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar2),TyInt64,this->m_func,
                                    AddrOpndKindDynamicMisc);
  reg = LowererMD::GetRegStackPointer();
  compareSrc1 = IR::RegOpnd::New((StackSym *)0x0,reg,TyInt64,this->m_func);
  InsertCompareBranch(this,&compareSrc1->super_Opnd,&compareSrc2->super_Opnd,BrGt_A,loopLabel,
                      insertInstr,false);
  instr_00 = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(insertInstr,&instr_00->super_Instr);
  newSrc = IR::HelperCallOpnd::New(HelperScriptAbort,this->m_func);
  pIVar4 = IR::Instr::New(Call,this->m_func);
  IR::Instr::SetSrc1(pIVar4,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,pIVar4);
  LowererMD::LowerCall(&this->m_lowererMD,pIVar4,0);
  pIVar4 = IR::Instr::GetPrevRealInstrOrLabel(this->m_func->m_exitInstr);
  IVar1 = IR::Instr::GetKind(pIVar4);
  local_51 = true;
  if (IVar1 != InstrKindLabel) {
    local_51 = IR::Instr::IsProfiledLabelInstr(pIVar4);
  }
  if (local_51 == false) {
    helperOpnd = (HelperCallOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertBefore(this->m_func->m_exitInstr,(Instr *)helperOpnd);
  }
  else {
    helperOpnd = (HelperCallOpnd *)IR::Instr::AsLabelInstr(pIVar4);
  }
  instr_01 = IR::BranchInstr::New(JMP,(LabelInstr *)helperOpnd,this->m_func);
  IR::Instr::InsertBefore(insertInstr,&instr_01->super_Instr);
  return;
}

Assistant:

void
Lowerer::InsertOneLoopProbe(IR::Instr *insertInstr, IR::LabelInstr *loopLabel)
{
    // Insert one interrupt probe at the given instruction. Probe the stack and call the abort helper
    // directly if the probe fails.

    IR::Opnd *memRefOpnd = IR::MemRefOpnd::New(
        m_func->GetThreadContextInfo()->GetThreadStackLimitAddr(),
        TyMachReg, this->m_func);

    IR::RegOpnd *regStackPointer = IR::RegOpnd::New(
        NULL, this->m_lowererMD.GetRegStackPointer(), TyMachReg, this->m_func);

    InsertCompareBranch(regStackPointer, memRefOpnd, Js::OpCode::BrGt_A, loopLabel, insertInstr);

    IR::LabelInstr *helperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    insertInstr->InsertBefore(helperLabel);

    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperScriptAbort, this->m_func);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Call, this->m_func);
    instr->SetSrc1(helperOpnd);
    insertInstr->InsertBefore(instr);
    this->m_lowererMD.LowerCall(instr, 0);

    // Jump to the exit after the helper call. This instruction will never be reached, but the jump
    // indicates that nothing is live after the call (to avoid useless spills in code that will
    // be executed).
    instr = this->m_func->m_exitInstr->GetPrevRealInstrOrLabel();
    if (instr->IsLabelInstr())
    {
        helperLabel = instr->AsLabelInstr();
    }
    else
    {
        helperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        this->m_func->m_exitInstr->InsertBefore(helperLabel);
    }

    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, helperLabel, this->m_func);
    insertInstr->InsertBefore(instr);
}